

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O1

void __thiscall
Component_componentMethods_Test::~Component_componentMethods_Test
          (Component_componentMethods_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Component, componentMethods)
{
    const std::string e1 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component/>\n"
        "  <component name=\"childA\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref>\n"
        "      <component_ref component=\"childA\"/>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    const std::string e2 =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"parent\"/>\n"
        "  <component name=\"gus\"/>\n"
        "  <component name=\"childB\"/>\n"
        "  <component name=\"child3\"/>\n"
        "  <encapsulation>\n"
        "    <component_ref component=\"parent\">\n"
        "      <component_ref component=\"gus\">\n"
        "        <component_ref component=\"childB\"/>\n"
        "        <component_ref component=\"child3\"/>\n"
        "      </component_ref>\n"
        "    </component_ref>\n"
        "  </encapsulation>\n"
        "</model>\n";
    libcellml::ModelPtr m = createModelWithComponent();
    libcellml::ComponentPtr c = m->component(0);
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();
    c1->setName("child1");
    c2->setName("child2");
    c3->setName("child3");
    c->addComponent(c1);

    libcellml::ComponentPtr cA = c->component(0);
    cA->setName("childA");

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e1, a);

    // Using const version of overloaded method
    const libcellml::ComponentPtr cS = c->component(0);
    // Can do this as we just have a const pointer
    cS->setName("gus");
    EXPECT_EQ("gus", cS->name());
    EXPECT_EQ(nullptr, c->component(4));

    libcellml::ComponentPtr cAr = c->component("gus");
    EXPECT_EQ("gus", cAr->name());

    // Modify a deeper Component
    c->setName("parent");
    c1->addComponent(c2);
    c1->addComponent(c3);

    libcellml::ComponentPtr cB = c->component(0);
    libcellml::ComponentPtr cBB = cB->component(0);
    cBB->setName("childB");

    EXPECT_EQ(nullptr, c->component(3));

    libcellml::ComponentPtr cSn = c->component("gus");
    EXPECT_EQ("gus", cSn->name());

    EXPECT_EQ(nullptr, c->component("child1", false));

    a = printer->printModel(m);
    EXPECT_EQ(e2, a);
}